

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

Gia_Man_t * Abc_GenSignedBooth(int nArgN,int nArgM)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p;
  int *piVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int *piVar6;
  Gia_Man_t *p_02;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int local_80;
  
  uVar10 = nArgM + nArgN + 1;
  iVar3 = (nArgM - ((int)(nArgM + 1U) >> 0x1f)) + 1 >> 1;
  iVar18 = (iVar3 + 1) * uVar10;
  p = (Vec_Int_t *)malloc(0x10);
  if (iVar18 - 1U < 0xf) {
    iVar18 = 0x10;
  }
  p->nSize = 0;
  p->nCap = iVar18;
  if (iVar18 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar18 << 2);
  }
  p->pArray = piVar5;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar18 = 0x10;
  if (0xe < nArgN + 1U) {
    iVar18 = nArgN + 2;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar18;
  if (iVar18 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar18 << 2);
  }
  p_00->pArray = piVar5;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar18 = 0x10;
  if (0xe < nArgM + 1U) {
    iVar18 = nArgM + 2;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar18;
  if (iVar18 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar18 << 2);
  }
  p_01->pArray = piVar6;
  p_02 = Gia_ManStart(1000);
  pcVar7 = (char *)malloc(6);
  builtin_strncpy(pcVar7,"booth",6);
  p_02->pName = pcVar7;
  Vec_IntPush(p_00,0);
  iVar18 = nArgN;
  if (0 < nArgN) {
    do {
      pGVar8 = Gia_ManAppendObj(p_02);
      uVar19 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar19 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar19 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_02->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_02->pObjs;
      if ((pGVar8 < pGVar2) || (pGVar2 + p_02->nObjs <= pGVar8)) goto LAB_002d1f36;
      Vec_IntPush(p_02->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_02->pObjs;
      if ((pGVar8 < pGVar2) || (pGVar2 + p_02->nObjs <= pGVar8)) goto LAB_002d1f36;
      Vec_IntPush(p_00,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * 0x55555556);
      iVar18 = iVar18 + -1;
    } while (iVar18 != 0);
  }
  if (0 < (long)p_00->nSize) {
    Vec_IntPush(p_00,p_00->pArray[(long)p_00->nSize + -1]);
    Vec_IntPush(p_01,0);
    iVar18 = nArgM;
    if (0 < nArgM) {
      do {
        pGVar8 = Gia_ManAppendObj(p_02);
        uVar19 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar19 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar19 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_02->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = p_02->pObjs;
        if ((pGVar8 < pGVar2) || (pGVar2 + p_02->nObjs <= pGVar8)) {
LAB_002d1f36:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_02->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = p_02->pObjs;
        if ((pGVar8 < pGVar2) || (pGVar2 + p_02->nObjs <= pGVar8)) goto LAB_002d1f36;
        Vec_IntPush(p_01,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * 0x55555556);
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
    }
    if (0 < (long)p_01->nSize) {
      uVar15 = nArgM + nArgN;
      Vec_IntPush(p_01,p_01->pArray[(long)p_01->nSize + -1]);
      if (-1 < (int)uVar15) {
        uVar19 = 0;
        do {
          iVar18 = 0;
          if ((int)((uint)(uVar19 >> 1) & 0x7fffffff) < iVar3 && (uVar19 & 1) == 0) {
            iVar18 = piVar6[uVar19 + 2];
          }
          Vec_IntPush(p,iVar18);
          uVar19 = uVar19 + 1;
        } while (nArgM + nArgN + 1 != uVar19);
      }
      Gia_ManHashAlloc(p_02);
      if (0 < nArgM) {
        local_80 = nArgM + -1;
        uVar19 = 0;
        uVar12 = uVar19;
        do {
          for (; uVar19 != 0; uVar19 = uVar19 - 1) {
            Vec_IntPush(p,0);
          }
          if (-1 < nArgN) {
            uVar19 = 0;
            do {
              uVar4 = Abc_GenSignedBoothPP
                                (p_02,piVar5[uVar19],piVar5[uVar19 + 1],piVar6[uVar12],
                                 piVar6[uVar12 | 1],piVar6[uVar12 + 2]);
              if ((int)uVar4 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              uVar1 = uVar19 + 1;
              Vec_IntPush(p,uVar4 ^ ((uint)nArgN == uVar19 && uVar12 != 0));
              uVar19 = uVar1;
            } while (nArgN + 1U != uVar1);
          }
          if ((long)p->nSize < 1) goto LAB_002d1f55;
          uVar4 = p->pArray[(long)p->nSize + -1];
          uVar13 = uVar4;
          if (uVar12 != 0) {
            uVar13 = 1;
          }
          Vec_IntPush(p,uVar13);
          iVar18 = nArgN + 2 + (int)uVar12;
          if (iVar18 <= (int)uVar15) {
            iVar16 = local_80;
            iVar11 = iVar18;
            do {
              if ((iVar11 <= iVar18 && uVar12 == 0) && ((int)uVar4 < 0)) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x131,"int Abc_LitNot(int)");
              }
              uVar13 = 0;
              if (iVar11 <= iVar18 && uVar12 == 0) {
                uVar13 = uVar4 ^ 1;
              }
              Vec_IntPush(p,uVar13);
              iVar11 = iVar11 + 1;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          uVar19 = uVar12 + 2;
          local_80 = local_80 + -2;
          uVar12 = uVar19;
        } while (uVar19 < (uint)(iVar3 * 2));
      }
      Gia_ManHashStop(p_02);
      if (-3 < nArgM) {
        lVar14 = 0;
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        uVar19 = 0;
        do {
          uVar12 = (ulong)uVar15;
          lVar17 = lVar14;
          if (0 < (int)uVar15) {
            do {
              if (((int)lVar14 < 0) || (p->nSize <= (int)lVar17)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              Gia_ManAppendCo(p_02,p->pArray[lVar17]);
              uVar12 = uVar12 - 1;
              lVar17 = lVar17 + 1;
            } while (uVar12 != 0);
          }
          uVar19 = uVar19 + 1;
          lVar14 = lVar14 + (ulong)uVar10;
        } while (uVar19 != iVar3 + 1);
      }
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      if (p_01->pArray != (int *)0x0) {
        free(p_01->pArray);
        p_01->pArray = (int *)0x0;
      }
      free(p_01);
      pGVar9 = Gia_ManCleanup(p_02);
      Gia_ManStop(p_02);
      return pGVar9;
    }
  }
LAB_002d1f55:
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Abc_GenSignedBooth( int nArgN, int nArgM )
{
    int nWidth = nArgN + nArgM + 1;
    int Length = (nArgM + 1) / 2;
    int i, k, iLit;

    Vec_Int_t * vPPs  = Vec_IntAlloc( nWidth * (Length + 1) );
    Vec_Int_t * vArgN = Vec_IntAlloc( nArgN + 2 );
    Vec_Int_t * vArgM = Vec_IntAlloc( nArgM + 2 );
    int * pArgN = Vec_IntArray( vArgN );
    int * pArgM = Vec_IntArray( vArgM );

    Gia_Man_t * pTemp, * pNew; 
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "booth" );

    Vec_IntPush( vArgN, 0 );
    for ( i = 0; i < nArgN; i++ )
        Vec_IntPush( vArgN, Gia_ManAppendCi(pNew) );
    Vec_IntPush( vArgN, Vec_IntEntryLast(vArgN) );

    Vec_IntPush( vArgM, 0 );
    for ( i = 0; i < nArgM; i++ )
        Vec_IntPush( vArgM, Gia_ManAppendCi(pNew) );
    Vec_IntPush( vArgM, Vec_IntEntryLast(vArgM) );

    for ( i = 0; i < nWidth; i++ )
        Vec_IntPush( vPPs, (i%2 == 0 && i/2 < Length) ? pArgM[i+2] : 0 );

    Gia_ManHashAlloc( pNew );
    for ( k = 0; k < 2*Length; k += 2 )
    {
        for ( i = 0; i < k; i++ )
            Vec_IntPush( vPPs, 0 );
        for ( i = 0; i <= nArgN; i++ )
        {
            iLit = Abc_GenSignedBoothPP( pNew, pArgN[i], pArgN[i+1], pArgM[k], pArgM[k+1], pArgM[k+2] );
            Vec_IntPush( vPPs, Abc_LitNotCond( iLit, k > 0 && i == nArgN ) );
        }
        iLit = Vec_IntEntryLast(vPPs);
        Vec_IntPush( vPPs, k > 0 ? 1 : iLit );
        for ( i = k+nArgN+2; i < nWidth; i++ )
            Vec_IntPush( vPPs, (k > 0 || i > k+nArgN+2) ? 0 : Abc_LitNot(iLit) );
    }
    Gia_ManHashStop( pNew );

    for ( k = 0; k <= Length; k++ )
        for ( i = 0; i < nArgN+nArgM; i++ )
            Gia_ManAppendCo( pNew, Vec_IntEntry(vPPs, k*(nArgN+nArgM+1) + i) );
    Vec_IntFree( vPPs );
    Vec_IntFree( vArgN );
    Vec_IntFree( vArgM );

    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}